

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O2

void __thiscall
hungarian_algorithm::
HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
::subtractSmallestUncoveredElement
          (HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
           *this)

{
  undefined1 *this_00;
  pointer pdVar1;
  bool bVar2;
  long lVar3;
  logic_error *this_01;
  size_t row;
  long lVar4;
  ulong __n;
  size_t col_1;
  size_t col;
  ulong uVar5;
  vector<bool,_std::allocator<bool>_> *__n_00;
  size_type __n_01;
  long lVar6;
  vector<bool,_std::allocator<bool>_> *this_02;
  reference rVar7;
  long local_78;
  allocator local_69;
  vector<bool,_std::allocator<bool>_> *local_68;
  long local_60;
  vector<bool,_std::allocator<bool>_> *local_58;
  string local_50 [32];
  
  local_78 = (this->zero_cost_).rep_;
  this_00 = &this->field_0x10;
  this_02 = (vector<bool,_std::allocator<bool>_> *)&this->field_0x38;
  lVar4 = 0;
  bVar2 = false;
  __n_00 = (vector<bool,_std::allocator<bool>_> *)0x0;
  local_60 = local_78;
  do {
    uVar5 = *(ulong *)this;
    if (uVar5 <= __n_00) {
      if (!bVar2) {
        this_01 = (logic_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  (local_50,"Hungarian algorithm: !found_minimum; this should never happen",
                   &local_69);
        std::logic_error::logic_error(this_01,local_50);
        __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      local_58 = (vector<bool,_std::allocator<bool>_> *)&this->field_0x60;
      __n_01 = 0;
      __n = 0;
      local_68 = this_02;
      do {
        if (uVar5 <= __n) {
          return;
        }
        for (uVar5 = 0; uVar5 < *(ulong *)&this->field_0x8; uVar5 = uVar5 + 1) {
          rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)this_00,__n);
          if (((*rVar7._M_p & rVar7._M_mask) == 0) ||
             (rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](this_02,uVar5),
             (*rVar7._M_p & rVar7._M_mask) == 0)) {
            rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)this_00,__n);
            if (((*rVar7._M_p & rVar7._M_mask) == 0) &&
               (rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](this_02,uVar5),
               (*rVar7._M_p & rVar7._M_mask) == 0)) {
              pdVar1 = (this->cost_matrix_).
                       super__Vector_base<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar6 = pdVar1[__n_01].rep_ - local_60;
              pdVar1[__n_01].rep_ = lVar6;
              lVar4 = (this->zero_cost_).rep_;
              rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](local_58,__n_01);
              if (lVar6 != lVar4) goto LAB_00118c04;
              goto LAB_00118bb2;
            }
          }
          else {
            pdVar1 = (this->cost_matrix_).
                     super__Vector_base<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar6 = pdVar1[__n_01].rep_ + local_60;
            pdVar1[__n_01].rep_ = lVar6;
            lVar4 = (this->zero_cost_).rep_;
            rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](local_58,__n_01);
            if (lVar6 == lVar4) {
LAB_00118bb2:
              *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
              this_02 = local_68;
            }
            else {
LAB_00118c04:
              *rVar7._M_p = *rVar7._M_p & ~rVar7._M_mask;
              this_02 = local_68;
            }
          }
          __n_01 = __n_01 + 1;
        }
        __n = __n + 1;
        uVar5 = *(ulong *)this;
      } while( true );
    }
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)this_00,(size_type)__n_00);
    if ((*rVar7._M_p & rVar7._M_mask) == 0) {
      local_68 = __n_00;
      for (uVar5 = 0; __n_00 = local_68, uVar5 < *(ulong *)&this->field_0x8; uVar5 = uVar5 + 1) {
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](this_02,uVar5);
        if ((*rVar7._M_p & rVar7._M_mask) == 0) {
          if (bVar2) {
            lVar6 = *(rep *)((long)&(this->cost_matrix_).
                                    super__Vector_base<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar5].rep_ +
                            *(long *)&this->field_0x8 * lVar4);
            lVar3 = lVar6;
            if (local_78 <= lVar6) goto LAB_00118ad1;
          }
          else {
            lVar6 = *(rep *)((long)&(this->cost_matrix_).
                                    super__Vector_base<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar5].rep_ +
                            *(long *)&this->field_0x8 * lVar4);
            bVar2 = true;
            lVar3 = lVar6;
          }
        }
        else {
LAB_00118ad1:
          lVar6 = local_60;
          lVar3 = local_78;
        }
        local_78 = lVar3;
        local_60 = lVar6;
      }
    }
    __n_00 = (vector<bool,_std::allocator<bool>_> *)((long)__n_00 + 1);
    lVar4 = lVar4 + 8;
  } while( true );
}

Assistant:

void subtractSmallestUncoveredElement()
  {
    // Find smallest uncovered element:
    bool found_minimum = false;
    Cost h = zero_cost_;
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      if (!covered_rows_[row])
      {
        for (std::size_t col = 0; col < num_cols_; ++col)
        {
          if (!covered_cols_[col])
          {
            if (!found_minimum)
            {
              h = cost_matrix_[getIndex(row, col)];
              found_minimum = true;
            }
            else
            {
              h = std::min(h, cost_matrix_[getIndex(row, col)]);
            }
          }
        }
      }
    }

    if (!found_minimum)
    {
      throw std::logic_error("Hungarian algorithm: !found_minimum; this should never happen");
    }

    // Subtract h from each uncovered element, and add h to each doubly covered element:
    std::size_t i = 0;
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      for (std::size_t col = 0; col < num_cols_; ++col, ++i)
      {
        if (covered_rows_[row] && covered_cols_[col])
        {
          cost_matrix_[i] += h;
          zero_matrix_[i] = (cost_matrix_[i] == zero_cost_);
        }
        else if (!covered_rows_[row] && !covered_cols_[col])
        {
          cost_matrix_[i] -= h;
          zero_matrix_[i] = (cost_matrix_[i] == zero_cost_);
        }
      }
    }
  }